

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O0

void __thiscall SQLite::Database::backup(Database *this,char *apFilename,BackupType aType)

{
  Database *aSrcDatabase;
  long in_FS_OFFSET;
  __uniq_ptr_impl<sqlite3_backup,_SQLite::Backup::Deleter> local_90;
  Backup local_68;
  Backup bkp;
  Database *dest;
  Database *src;
  BackupType aType_local;
  char *apFilename_local;
  Database *this_local;
  Database otherDatabase;
  
  otherDatabase._32_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  Database((Database *)&this_local,apFilename,6,0,(char *)0x0);
  if (aType == Save) {
    local_90._M_t.super__Tuple_impl<0UL,_sqlite3_backup_*,_SQLite::Backup::Deleter>.
    super__Head_base<0UL,_sqlite3_backup_*,_false>._M_head_impl =
         (tuple<sqlite3_backup_*,_SQLite::Backup::Deleter>)&this_local;
    aSrcDatabase = this;
  }
  else {
    aSrcDatabase = (Database *)&this_local;
    local_90._M_t.super__Tuple_impl<0UL,_sqlite3_backup_*,_SQLite::Backup::Deleter>.
    super__Head_base<0UL,_sqlite3_backup_*,_false>._M_head_impl =
         (tuple<sqlite3_backup_*,_SQLite::Backup::Deleter>)
         (tuple<sqlite3_backup_*,_SQLite::Backup::Deleter>)this;
  }
  bkp.mpSQLiteBackup._M_t.super___uniq_ptr_impl<sqlite3_backup,_SQLite::Backup::Deleter>._M_t.
  super__Tuple_impl<0UL,_sqlite3_backup_*,_SQLite::Backup::Deleter>.
  super__Head_base<0UL,_sqlite3_backup_*,_false>._M_head_impl =
       (unique_ptr<sqlite3_backup,_SQLite::Backup::Deleter>)
       (unique_ptr<sqlite3_backup,_SQLite::Backup::Deleter>)
       local_90._M_t.super__Tuple_impl<0UL,_sqlite3_backup_*,_SQLite::Backup::Deleter>.
       super__Head_base<0UL,_sqlite3_backup_*,_false>._M_head_impl;
  Backup::Backup(&local_68,
                 (Database *)
                 local_90._M_t.super__Tuple_impl<0UL,_sqlite3_backup_*,_SQLite::Backup::Deleter>.
                 super__Head_base<0UL,_sqlite3_backup_*,_false>._M_head_impl,aSrcDatabase);
  Backup::executeStep(&local_68,-1);
  Backup::~Backup(&local_68);
  ~Database((Database *)&this_local);
  if (*(long *)(in_FS_OFFSET + 0x28) != otherDatabase._32_8_) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Database::backup(const char* apFilename, BackupType aType)
{
    // Open the database file identified by apFilename
    Database otherDatabase(apFilename, SQLite::OPEN_READWRITE | SQLite::OPEN_CREATE);

    // For a 'Save' operation, data is copied from the current Database to the other. A 'Load' is the reverse.
    Database& src = (aType == BackupType::Save ? *this : otherDatabase);
    Database& dest = (aType == BackupType::Save ? otherDatabase : *this);

    // Set up the backup procedure to copy between the "main" databases of each connection
    Backup bkp(dest, src);
    bkp.executeStep(); // Execute all steps at once

    // RAII Finish Backup an Close the other Database
}